

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_create(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **ctx)

{
  int iVar1;
  int local_2c;
  EVP_PKEY *pEStack_28;
  int ret;
  EVP_PKEY *pkey;
  EVP_PKEY_CTX *evpctx;
  ptls_key_exchange_context_t **ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  pkey = (EVP_PKEY *)0x0;
  pEStack_28 = (EVP_PKEY *)0x0;
  evpctx = (EVP_PKEY_CTX *)ctx;
  ctx_local = (ptls_key_exchange_context_t **)algo;
  pkey = (EVP_PKEY *)EVP_PKEY_CTX_new_id((int)algo->data,(ENGINE *)0x0);
  if (pkey == (EVP_PKEY *)0x0) {
    local_2c = 0x203;
  }
  else {
    iVar1 = EVP_PKEY_keygen_init((EVP_PKEY_CTX *)pkey);
    if (iVar1 < 1) {
      local_2c = 0x203;
    }
    else {
      iVar1 = EVP_PKEY_keygen((EVP_PKEY_CTX *)pkey,&stack0xffffffffffffffd8);
      if (iVar1 < 1) {
        local_2c = 0x203;
      }
      else {
        local_2c = evp_keyex_init((ptls_key_exchange_algorithm_t *)ctx_local,
                                  (ptls_key_exchange_context_t **)evpctx,(EVP_PKEY *)pEStack_28);
        if (local_2c == 0) {
          pEStack_28 = (EVP_PKEY *)0x0;
          local_2c = 0;
        }
      }
    }
  }
  if (pEStack_28 != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(pEStack_28);
  }
  if (pkey != (EVP_PKEY *)0x0) {
    EVP_PKEY_CTX_free((EVP_PKEY_CTX *)pkey);
  }
  return local_2c;
}

Assistant:

static int evp_keyex_create(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **ctx)
{
    EVP_PKEY_CTX *evpctx = NULL;
    EVP_PKEY *pkey = NULL;
    int ret;

    /* generate private key */
    if ((evpctx = EVP_PKEY_CTX_new_id((int)algo->data, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_keygen_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_keygen(evpctx, &pkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* setup */
    if ((ret = evp_keyex_init(algo, ctx, pkey)) != 0)
        goto Exit;
    pkey = NULL;
    ret = 0;

Exit:
    if (pkey != NULL)
        EVP_PKEY_free(pkey);
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    return ret;
}